

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O3

int LUDecompose(double **a,int n,double *vv,int *indx,double *pd)

{
  double **ppdVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  ulong unaff_RBX;
  ulong uVar9;
  ulong uVar10;
  double **ppdVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  if (n < 1) {
    dVar15 = 1.0;
  }
  else {
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    dVar15 = 1.0;
    uVar7 = (ulong)(uint)n;
    uVar9 = 0;
    do {
      auVar17 = ZEXT816(0) << 0x40;
      uVar10 = 0;
      do {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = a[uVar9][uVar10];
        uVar10 = uVar10 + 1;
        auVar18 = vandpd_avx(auVar18,auVar14);
        auVar17 = vmaxsd_avx(auVar18,auVar17);
      } while (uVar7 != uVar10);
      dVar16 = auVar17._0_8_;
      if ((dVar16 == 0.0) && (!NAN(dVar16))) {
        printf("singular matrix in routine LUDecompose");
        return 1;
      }
      vv[uVar9] = 1.0 / dVar16;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
    if (0 < n) {
      uVar10 = 0;
      dVar15 = 1.0;
      uVar9 = uVar7;
      ppdVar11 = a;
      do {
        if (uVar10 != 0) {
          uVar13 = 0;
          do {
            pdVar3 = a[uVar13];
            dVar16 = pdVar3[uVar10];
            auVar20 = ZEXT864((ulong)dVar16);
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                ppdVar1 = a + uVar12;
                auVar21._8_8_ = 0;
                auVar21._0_8_ = pdVar3[uVar12];
                uVar12 = uVar12 + 1;
                auVar17._8_8_ = 0;
                auVar17._0_8_ = (*ppdVar1)[uVar10];
                auVar17 = vfnmadd231sd_fma(auVar20._0_16_,auVar21,auVar17);
                auVar20 = ZEXT1664(auVar17);
                dVar16 = auVar17._0_8_;
              } while (uVar13 != uVar12);
            }
            uVar13 = uVar13 + 1;
            pdVar3[uVar10] = dVar16;
          } while (uVar13 != uVar10);
        }
        auVar20 = ZEXT864(0) << 0x40;
        uVar13 = uVar10;
        do {
          pdVar3 = a[uVar13];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = pdVar3[uVar10];
          if (uVar10 != 0) {
            uVar12 = 0;
            do {
              ppdVar1 = a + uVar12;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = pdVar3[uVar12];
              uVar12 = uVar12 + 1;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (*ppdVar1)[uVar10];
              auVar22 = vfnmadd231sd_fma(auVar22,auVar24,auVar2);
            } while (uVar10 != uVar12);
          }
          pdVar3[uVar10] = auVar22._0_8_;
          auVar17 = vandpd_avx(auVar22,auVar14);
          dVar16 = auVar17._0_8_ * vv[uVar13];
          dVar19 = auVar20._0_8_;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar16;
          uVar5 = vcmpsd_avx512f(auVar20._0_16_,auVar23,6);
          bVar6 = (bool)((byte)uVar5 & 1);
          auVar20 = ZEXT864((ulong)bVar6 * (long)dVar19 + (ulong)!bVar6 * (long)dVar16);
          uVar12 = unaff_RBX;
          if (dVar19 <= dVar16) {
            uVar12 = uVar13;
          }
          unaff_RBX = uVar12 & 0xffffffff;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar7);
        iVar8 = (int)uVar12;
        if (uVar10 != (uVar12 & 0xffffffff)) {
          pdVar3 = a[uVar10];
          uVar13 = 0;
          pdVar4 = a[iVar8];
          do {
            dVar16 = pdVar4[uVar13];
            pdVar4[uVar13] = pdVar3[uVar13];
            pdVar3[uVar13] = dVar16;
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
          dVar15 = -dVar15;
          vv[iVar8] = vv[uVar10];
        }
        indx[uVar10] = iVar8;
        dVar16 = a[uVar10][uVar10];
        if ((dVar16 == 0.0) && (!NAN(dVar16))) {
          dVar16 = 1e-20;
          a[uVar10][uVar10] = 1e-20;
        }
        if ((uVar10 != n - 1) && ((long)(uVar10 + 1) < (long)uVar7)) {
          uVar13 = 1;
          do {
            ppdVar1 = ppdVar11 + uVar13;
            uVar13 = uVar13 + 1;
            (*ppdVar1)[uVar10] = (1.0 / dVar16) * (*ppdVar1)[uVar10];
          } while (uVar9 != uVar13);
        }
        uVar10 = uVar10 + 1;
        ppdVar11 = ppdVar11 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar10 != uVar7);
    }
  }
  if (pd != (double *)0x0) {
    *pd = dVar15;
  }
  return 0;
}

Assistant:

int LUDecompose (double **a, int n, double *vv, int *indx, double *pd)
	/*   **a = the matrix whose LU-decomposition is wanted                    */
	/*     n = order of a                                                     */
	/*   *vv = work vector of size n (stores implicit scaling of each row)    */
	/* *indx => row permutation according to partial pivoting sequence        */
	/*   *pd => 1 if number of row interchanges was even, -1 if odd (NULL OK) */
{
	int			i, imax, j, k;
	double		big, dum, sum, temp, d;

	d = 1.0;
	for (i = 0; i < n; i++)
		{
		big = 0.0;
		for (j = 0; j < n; j++)
			{
			if ((temp = fabs(a[i][j])) > big)
				big = temp;
			}
		if (big == 0.0)
			{
			printf("singular matrix in routine LUDecompose");
			return ERROR;
			}
		vv[i] = ONE_POINT_ZERO / big;
		}
	for (j = 0; j < n; j++)
		{
		for (i = 0; i < j; i++)
			{
			sum = a[i][j];
			for (k = 0; k < i; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			}
		big = 0.0;
		for (i = j; i < n; i++)
			{
			sum = a[i][j];
			for (k = 0; k < j; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			dum = vv[i] * fabs(sum);
			if (dum >= big)
				{
				big = dum;
				imax = i;
				}
			}
		if (j != imax)
			{
			for (k = 0; k < n; k++)
				{
				dum = a[imax][k];
				a[imax][k] = a[j][k];
				a[j][k] = dum;
				}	
			d = -d;
			vv[imax] = vv[j];
			}
		indx[j] = imax;
		if (a[j][j] == 0.0)
			a[j][j] = TINY;
		if (j != n - 1)
			{
			dum = ONE_POINT_ZERO / (a[j][j]);
			for (i = j + 1; i < n; i++)
				a[i][j] *= dum;
			}
		}

	if (pd != NULL)
		*pd = d;
	return NO_ERROR;
}